

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

mp_int * mp_invert_mod_2to(mp_int *x,size_t p)

{
  BignumInt *pBVar1;
  size_t nw;
  mp_int *x_00;
  size_t len;
  mp_int *x_01;
  ulong len_00;
  ulong len_01;
  mp_int scratch;
  undefined1 local_108 [8];
  mp_int r1_position;
  size_t Bpos;
  mp_int r1;
  mp_int r0x1;
  mp_int x1;
  mp_int K;
  mp_int Kshift;
  mp_int r0;
  mp_int x0;
  size_t B2w;
  size_t Bw;
  mp_int scratch_this_iter;
  size_t b;
  mp_int mul_scratch;
  mp_int scratch_per_iter;
  mp_int *scratch_orig;
  size_t mul_scratchsize;
  mp_int *r;
  size_t rw;
  size_t p_local;
  mp_int *x_local;
  
  if (x->nw == 0) {
    __assert_fail("x->nw > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                  ,0x50a,"mp_int *mp_invert_mod_2to(mp_int *, size_t)");
  }
  if ((*x->w & 1) != 0) {
    if (p != 0) {
      nw = size_t_max(p + 0x3f >> 6,1);
      x_00 = mp_make_sized(nw);
      len = mp_mul_scratchspace(nw << 1,nw,nw);
      x_01 = mp_make_sized(nw * 6 + len);
      mul_scratch.w = (BignumInt *)x_01->nw;
      pBVar1 = x_01->w;
      scratch = mp_alloc_from_scratch((mp_int *)&mul_scratch.w,len);
      *x_00->w = 1;
      for (scratch_this_iter.w = (BignumInt *)0x1; scratch_this_iter.w < p;
          scratch_this_iter.w = (BignumInt *)((long)scratch_this_iter.w << 1)) {
        Bw = (size_t)mul_scratch.w;
        len_00 = (long)scratch_this_iter.w + 0x3fU >> 6;
        len_01 = (long)scratch_this_iter.w * 2 + 0x3fU >> 6;
        scratch_this_iter.nw = (size_t)pBVar1;
        join_0x00000010_0x00000000_ = mp_alloc_from_scratch((mp_int *)&Bw,len_00);
        mp_copy_into((mp_int *)&r0.w,x);
        mp_reduce_mod_2to((mp_int *)&r0.w,(size_t)scratch_this_iter.w);
        join_0x00000010_0x00000000_ = mp_make_alias(x_00,0,len_00);
        join_0x00000010_0x00000000_ = mp_alloc_from_scratch((mp_int *)&Bw,len_01);
        mp_mul_internal((mp_int *)&K.w,(mp_int *)&r0.w,(mp_int *)&Kshift.w,scratch);
        join_0x00000010_0x00000000_ = mp_alloc_from_scratch((mp_int *)&Bw,len_00);
        mp_rshift_fixed_into((mp_int *)&x1.w,(mp_int *)&K.w,(size_t)scratch_this_iter.w);
        join_0x00000010_0x00000000_ = mp_alloc_from_scratch((mp_int *)&Bw,len_00);
        mp_rshift_fixed_into((mp_int *)&r0x1.w,x,(size_t)scratch_this_iter.w);
        mp_reduce_mod_2to((mp_int *)&r0x1.w,(size_t)scratch_this_iter.w);
        join_0x00000010_0x00000000_ = mp_make_alias((mp_int *)&K.w,0,len_00);
        mp_mul_internal((mp_int *)&r1.w,(mp_int *)&Kshift.w,(mp_int *)&r0x1.w,scratch);
        mp_add_into((mp_int *)&r1.w,(mp_int *)&r1.w,(mp_int *)&x1.w);
        mp_neg_into((mp_int *)&r1.w,(mp_int *)&r1.w);
        _Bpos = mp_alloc_from_scratch((mp_int *)&Bw,len_00);
        mp_mul_internal((mp_int *)&Bpos,(mp_int *)&Kshift.w,(mp_int *)&r1.w,scratch);
        mp_reduce_mod_2to((mp_int *)&Bpos,(size_t)scratch_this_iter.w);
        mp_lshift_fixed_into((mp_int *)&x1.w,(mp_int *)&Bpos,(ulong)scratch_this_iter.w & 0x3f);
        r1_position.w = (BignumInt *)((ulong)scratch_this_iter.w >> 6);
        _local_108 = mp_make_alias(x_00,(size_t)r1_position.w,len_01 - (long)r1_position.w);
        mp_add_into((mp_int *)local_108,(mp_int *)local_108,(mp_int *)&x1.w);
      }
      mp_reduce_mod_2to(x_00,p);
      mp_free(x_01);
      return x_00;
    }
    __assert_fail("p > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                  ,0x50c,"mp_int *mp_invert_mod_2to(mp_int *, size_t)");
  }
  __assert_fail("x->w[0] & 1",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0x50b,"mp_int *mp_invert_mod_2to(mp_int *, size_t)");
}

Assistant:

mp_int *mp_invert_mod_2to(mp_int *x, size_t p)
{
    /* Input checks: x must be coprime to the modulus, i.e. odd, and p
     * can't be zero */
    assert(x->nw > 0);
    assert(x->w[0] & 1);
    assert(p > 0);

    size_t rw = (p + BIGNUM_INT_BITS - 1) / BIGNUM_INT_BITS;
    rw = size_t_max(rw, 1);
    mp_int *r = mp_make_sized(rw);

    size_t mul_scratchsize = mp_mul_scratchspace(2*rw, rw, rw);
    mp_int *scratch_orig = mp_make_sized(6 * rw + mul_scratchsize);
    mp_int scratch_per_iter = *scratch_orig;
    mp_int mul_scratch = mp_alloc_from_scratch(
        &scratch_per_iter, mul_scratchsize);

    r->w[0] = 1;

    for (size_t b = 1; b < p; b <<= 1) {
        /*
         * In each step of this iteration, we have the inverse of x
         * mod 2^b, and we want the inverse of x mod 2^{2b}.
         *
         * Write B = 2^b for convenience, so we want x^{-1} mod B^2.
         * Let x = x_0 + B x_1 + k B^2, with 0 <= x_0,x_1 < B.
         *
         * We want to find r_0 and r_1 such that
         *    (r_1 B + r_0) (x_1 B + x_0) == 1 (mod B^2)
         *
         * To begin with, we know r_0 must be the inverse mod B of
         * x_0, i.e. of x, i.e. it is the inverse we computed in the
         * previous iteration. So now all we need is r_1.
         *
         * Multiplying out, neglecting multiples of B^2, and writing
         * x_0 r_0 = K B + 1, we have
         *
         *    r_1 x_0 B + r_0 x_1 B + K B == 0                    (mod B^2)
         * =>                   r_1 x_0 B == - r_0 x_1 B - K B    (mod B^2)
         * =>                     r_1 x_0 == - r_0 x_1 - K        (mod B)
         * =>                         r_1 == r_0 (- r_0 x_1 - K)  (mod B)
         *
         * (the last step because we multiply through by the inverse
         * of x_0, which we already know is r_0).
         */

        mp_int scratch_this_iter = scratch_per_iter;
        size_t Bw = (b + BIGNUM_INT_BITS - 1) / BIGNUM_INT_BITS;
        size_t B2w = (2*b + BIGNUM_INT_BITS - 1) / BIGNUM_INT_BITS;

        /* Start by finding K: multiply x_0 by r_0, and shift down. */
        mp_int x0 = mp_alloc_from_scratch(&scratch_this_iter, Bw);
        mp_copy_into(&x0, x);
        mp_reduce_mod_2to(&x0, b);
        mp_int r0 = mp_make_alias(r, 0, Bw);
        mp_int Kshift = mp_alloc_from_scratch(&scratch_this_iter, B2w);
        mp_mul_internal(&Kshift, &x0, &r0, mul_scratch);
        mp_int K = mp_alloc_from_scratch(&scratch_this_iter, Bw);
        mp_rshift_fixed_into(&K, &Kshift, b);

        /* Now compute the product r_0 x_1, reusing the space of Kshift. */
        mp_int x1 = mp_alloc_from_scratch(&scratch_this_iter, Bw);
        mp_rshift_fixed_into(&x1, x, b);
        mp_reduce_mod_2to(&x1, b);
        mp_int r0x1 = mp_make_alias(&Kshift, 0, Bw);
        mp_mul_internal(&r0x1, &r0, &x1, mul_scratch);

        /* Add K to that. */
        mp_add_into(&r0x1, &r0x1, &K);

        /* Negate it. */
        mp_neg_into(&r0x1, &r0x1);

        /* Multiply by r_0. */
        mp_int r1 = mp_alloc_from_scratch(&scratch_this_iter, Bw);
        mp_mul_internal(&r1, &r0, &r0x1, mul_scratch);
        mp_reduce_mod_2to(&r1, b);

        /* That's our r_1, so add it on to r_0 to get the full inverse
         * output from this iteration. */
        mp_lshift_fixed_into(&K, &r1, (b % BIGNUM_INT_BITS));
        size_t Bpos = b / BIGNUM_INT_BITS;
        mp_int r1_position = mp_make_alias(r, Bpos, B2w-Bpos);
        mp_add_into(&r1_position, &r1_position, &K);
    }

    /* Finally, reduce mod the precise desired number of bits. */
    mp_reduce_mod_2to(r, p);

    mp_free(scratch_orig);
    return r;
}